

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation_deltaeta
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag)

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  double *pdVar7;
  void *__s;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  double dVar15;
  
  uVar1 = this->N_rap;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar1) {
    uVar8 = (long)(int)uVar1 * 8;
  }
  __s = operator_new__(uVar8);
  iVar2 = this->order_max;
  if (0 < (long)iVar2) {
    uVar8 = (ulong)uVar1;
    pvVar3 = (this->QnSP_eta12).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (this->QnSP_eta12_err).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar14 = 0;
    do {
      if (0 < (int)uVar1) {
        memset(__s,0,uVar8 * 8);
        pvVar5 = (event_Qn_diff_real->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = (event_Qn_diff_imag->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = -(int)(this->rapidity_dis_min / this->drap);
        lVar9 = 0;
        uVar10 = 0;
        do {
          lVar11 = 0;
          uVar13 = uVar12;
          do {
            if (uVar13 < uVar1) {
              pdVar7 = pvVar5[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar15 = pdVar7[lVar14] *
                       *(double *)
                        (*(long *)((long)&(pvVar5->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data + lVar11) + lVar14 * 8) +
                       *(double *)
                        (*(long *)&pvVar6[uVar10].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + lVar14 * 8) *
                       *(double *)
                        (*(long *)((long)&(pvVar6->
                                          super__Vector_base<double,_std::allocator<double>_>).
                                          _M_impl.super__Vector_impl_data + lVar11) + lVar14 * 8);
              if (lVar9 == lVar11) {
                dVar15 = dVar15 - *pdVar7;
              }
              *(double *)((long)__s + (ulong)uVar13 * 8) =
                   dVar15 + *(double *)((long)__s + (ulong)uVar13 * 8);
            }
            uVar13 = uVar13 - 1;
            lVar11 = lVar11 + 0x18;
          } while (uVar8 * 0x18 != lVar11);
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 0x18;
        } while (uVar10 != uVar8);
      }
      if (0 < (int)uVar1) {
        lVar9 = *(long *)&pvVar3[lVar14].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        lVar11 = *(long *)&pvVar4[lVar14].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        uVar10 = 0;
        do {
          *(double *)(lVar9 + uVar10 * 8) =
               *(double *)((long)__s + uVar10 * 8) + *(double *)(lVar9 + uVar10 * 8);
          dVar15 = *(double *)((long)__s + uVar10 * 8);
          *(double *)(lVar11 + uVar10 * 8) = dVar15 * dVar15 + *(double *)(lVar11 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != iVar2);
  }
  operator_delete__(__s);
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation_deltaeta(
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_imag) {
    double *temp_corr = new double[N_rap];
    for (int i = 0; i < order_max; i++) {
        for (int j = 0; j < N_rap; j++) {
            temp_corr[j] = 0.0;
        }
        for (int ii = 0; ii < N_rap; ii++) {
            for (int jj = 0; jj < N_rap; jj++) {
                int rap_idx =
                    ((ii - jj) - static_cast<int>(rapidity_dis_min / drap));
                if (rap_idx >= 0 && rap_idx < N_rap) {
                    double QnSP_rap_local =
                        (event_Qn_diff_real[ii][i] * event_Qn_diff_real[jj][i]
                         + event_Qn_diff_imag[ii][i]
                               * event_Qn_diff_imag[jj][i]);
                    if (ii == jj) {
                        QnSP_rap_local -= event_Qn_diff_real[ii][0];
                    }
                    temp_corr[rap_idx] += QnSP_rap_local;
                }
            }
        }
        for (int j = 0; j < N_rap; j++) {
            QnSP_eta12[i][j] += temp_corr[j];
            QnSP_eta12_err[i][j] += temp_corr[j] * temp_corr[j];
        }
    }
    delete[] temp_corr;
}